

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O1

void ncnn::convdw5x5s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  void *pvVar7;
  void *pvVar8;
  undefined1 (*pauVar9) [16];
  void *pvVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  undefined1 auVar19 [16];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->w;
    iVar3 = top_blob->h;
    pvVar4 = _bias->data;
    lVar13 = (long)((bottom_blob->w - iVar2) * 8);
    lVar11 = 0;
    do {
      if (pvVar4 == (void *)0x0) {
        auVar19 = ZEXT816(0) << 0x40;
      }
      else {
        auVar19 = *(undefined1 (*) [16])((long)pvVar4 + lVar11 * 0x10);
      }
      if (0 < iVar3) {
        pauVar9 = (undefined1 (*) [16])
                  (top_blob->cstep * lVar11 * top_blob->elemsize + (long)top_blob->data);
        lVar18 = kernel->w * lVar11 * kernel->elemsize;
        pvVar5 = kernel->data;
        pvVar15 = (void *)(bottom_blob->cstep * lVar11 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar16 = (long)bottom_blob->w * bottom_blob->elemsize;
        pvVar10 = (void *)((long)pvVar15 + lVar16 * 4);
        pvVar7 = (void *)(lVar16 * 3 + (long)pvVar15);
        pvVar8 = (void *)((long)pvVar15 + lVar16 * 2);
        pvVar17 = (void *)(lVar16 + (long)pvVar15);
        iVar14 = 0;
        do {
          if (0 < iVar2) {
            lVar16 = 0;
            iVar12 = iVar2;
            do {
              auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar5 + lVar18),auVar19,
                                       *(undefined1 (*) [16])((long)pvVar15 + lVar16));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x10),
                                       *(undefined1 (*) [16])((long)pvVar15 + lVar16 + 0x10));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x20),
                                       *(undefined1 (*) [16])((long)pvVar15 + lVar16 + 0x20));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x30),
                                       *(undefined1 (*) [16])((long)pvVar15 + lVar16 + 0x30));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x40),
                                       *(undefined1 (*) [16])((long)pvVar15 + lVar16 + 0x40));
              auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x50),auVar6,
                                       *(undefined1 (*) [16])((long)pvVar17 + lVar16));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x60),
                                       *(undefined1 (*) [16])((long)pvVar17 + lVar16 + 0x10));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x70),
                                       *(undefined1 (*) [16])((long)pvVar17 + lVar16 + 0x20));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x80),
                                       *(undefined1 (*) [16])((long)pvVar17 + lVar16 + 0x30));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x90),
                                       *(undefined1 (*) [16])((long)pvVar17 + lVar16 + 0x40));
              auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xa0),auVar6,
                                       *(undefined1 (*) [16])((long)pvVar8 + lVar16));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xb0),
                                       *(undefined1 (*) [16])((long)pvVar8 + lVar16 + 0x10));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xc0),
                                       *(undefined1 (*) [16])((long)pvVar8 + lVar16 + 0x20));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xd0),
                                       *(undefined1 (*) [16])((long)pvVar8 + lVar16 + 0x30));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xe0),
                                       *(undefined1 (*) [16])((long)pvVar8 + lVar16 + 0x40));
              auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0xf0),auVar6,
                                       *(undefined1 (*) [16])((long)pvVar7 + lVar16));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x100),
                                       *(undefined1 (*) [16])((long)pvVar7 + lVar16 + 0x10));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x110),
                                       *(undefined1 (*) [16])((long)pvVar7 + lVar16 + 0x20));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x120),
                                       *(undefined1 (*) [16])((long)pvVar7 + lVar16 + 0x30));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x130),
                                       *(undefined1 (*) [16])((long)pvVar7 + lVar16 + 0x40));
              auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x140),auVar6,
                                       *(undefined1 (*) [16])((long)pvVar10 + lVar16));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x150),
                                       *(undefined1 (*) [16])((long)pvVar10 + lVar16 + 0x10));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x160),
                                       *(undefined1 (*) [16])((long)pvVar10 + lVar16 + 0x20));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x170),
                                       *(undefined1 (*) [16])((long)pvVar10 + lVar16 + 0x30));
              auVar6 = vfmadd231ps_fma(auVar6,*(undefined1 (*) [16])((long)pvVar5 + lVar18 + 0x180),
                                       *(undefined1 (*) [16])((long)pvVar10 + lVar16 + 0x40));
              *pauVar9 = auVar6;
              pauVar9 = pauVar9 + 1;
              lVar16 = lVar16 + 0x20;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            pvVar10 = (void *)((long)pvVar10 + lVar16);
            pvVar7 = (void *)((long)pvVar7 + lVar16);
            pvVar8 = (void *)((long)pvVar8 + lVar16);
            pvVar17 = (void *)((long)pvVar17 + lVar16);
            pvVar15 = (void *)((long)pvVar15 + lVar16);
          }
          pvVar15 = (void *)((long)pvVar15 + lVar13 * 4);
          pvVar17 = (void *)((long)pvVar17 + lVar13 * 4);
          pvVar8 = (void *)((long)pvVar8 + lVar13 * 4);
          pvVar7 = (void *)((long)pvVar7 + lVar13 * 4);
          pvVar10 = (void *)((long)pvVar10 + lVar13 * 4);
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar3);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar1);
  }
  return;
}

Assistant:

static void convdw5x5s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out;

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4 * 2;
                r1 += 4 * 2;
                r2 += 4 * 2;
                r3 += 4 * 2;
                r4 += 4 * 2;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}